

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O1

TRef lj_opt_narrow_index(jit_State *J,TRef tr)

{
  byte bVar1;
  IRIns *pIVar2;
  IRRef1 IVar3;
  TRef TVar4;
  ulong uVar5;
  IROpT IVar6;
  
  if ((tr & 0x1f000000) == 0xe000000) {
    IVar3 = 0x226e;
    IVar6 = 0x5b93;
LAB_0012a251:
    (J->fold).ins.field_0.ot = IVar6;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = IVar3;
    TVar4 = lj_opt_fold(J);
    return TVar4;
  }
  pIVar2 = (J->cur).ir;
  uVar5 = (ulong)tr & 0xffff;
  bVar1 = *(byte *)((long)pIVar2 + uVar5 * 8 + 5);
  if ((byte)(bVar1 - 0x35) < 2) {
    IVar3 = *(IRRef1 *)((long)pIVar2 + uVar5 * 8 + 2);
    if ((-1 < (long)(short)IVar3) && (-1 < (int)(pIVar2[(short)IVar3].field_1.op12 + 0x40000000))) {
      IVar6 = (ushort)bVar1 * 0x100 - 0xbed;
      tr = (TRef)pIVar2[uVar5].field_0.op1;
      goto LAB_0012a251;
    }
  }
  return tr;
}

Assistant:

TRef LJ_FASTCALL lj_opt_narrow_index(jit_State *J, TRef tr)
{
  IRIns *ir;
  lj_assertJ(tref_isnumber(tr), "expected number type");
  if (tref_isnum(tr))  /* Conversion may be narrowed, too. See above. */
    return emitir(IRTGI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_INDEX);
  /* Omit some overflow checks for array indexing. See comments above. */
  ir = IR(tref_ref(tr));
  if ((ir->o == IR_ADDOV || ir->o == IR_SUBOV) && irref_isk(ir->op2) &&
      (uint32_t)IR(ir->op2)->i + 0x40000000u < 0x80000000u)
    return emitir(IRTI(ir->o - IR_ADDOV + IR_ADD), ir->op1, ir->op2);
  return tr;
}